

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

void __thiscall BanMan::ClearBanned(BanMan *this)

{
  CClientUIInterface *in_RDI;
  long in_FS_OFFSET;
  char *unaff_retaddr;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock4;
  BanMan *in_stack_00000058;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)in_RDI);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)criticalblock4.super_unique_lock._8_8_,
             (AnnotatedMixin<std::mutex> *)criticalblock4.super_unique_lock._M_device,(char *)this,
             unaff_retaddr,(int)((ulong)lVar1 >> 0x20),SUB81((ulong)lVar1 >> 0x18,0));
  std::
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::clear((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
           *)in_RDI);
  in_RDI[0x58] = (CClientUIInterface)0x1;
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_RDI);
  DumpBanlist(in_stack_00000058);
  if (*(long *)(in_RDI + 0x60) != 0) {
    CClientUIInterface::BannedListChanged(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::ClearBanned()
{
    {
        LOCK(m_banned_mutex);
        m_banned.clear();
        m_is_dirty = true;
    }
    DumpBanlist(); //store banlist to disk
    if (m_client_interface) m_client_interface->BannedListChanged();
}